

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::append<char_const*,void>
          (SmallVectorImpl<unsigned_char> *this,char *in_start,char *in_end)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (long)in_end - (long)in_start;
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                 super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<unsigned_char,_true>).
      super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity - uVar1 <
      uVar2) {
    SmallVectorTemplateBase<unsigned_char,_true>::grow
              (&this->super_SmallVectorTemplateBase<unsigned_char,_true>,uVar1 + uVar2);
    uVar1 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                   super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*,unsigned_char*>
            (in_start,in_end,
             (uchar *)(uVar1 + (long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                                     super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                     super_SmallVectorBase.BeginX));
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             uVar2 + (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                     super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size
            );
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }